

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotL.c
# Opt level: O3

int zpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int_t iVar4;
  void *pvVar5;
  int_t *piVar6;
  double dVar7;
  undefined8 uVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  doublecomplex *z;
  int iVar18;
  int iVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  doublecomplex temp;
  doublecomplex one;
  doublecomplex local_98;
  double local_88;
  long local_80;
  ulong local_78;
  void *local_70;
  long local_68;
  int *local_60;
  ulong local_58;
  flops_t *local_50;
  doublecomplex local_48;
  
  local_78 = (ulong)(uint)jcol;
  local_48.r = 1.0;
  local_48.i = 0.0;
  local_50 = stat->ops;
  pvVar5 = Glu->lusup;
  local_68 = (long)Glu->xsup[Glu->supno[jcol]];
  iVar12 = Glu->xlsub[local_68];
  iVar18 = Glu->xlsub[local_68 + 1] - iVar12;
  iVar3 = Glu->xlusup[local_68];
  iVar11 = Glu->xlusup[jcol];
  piVar6 = Glu->lsub;
  iVar13 = jcol - Glu->xsup[Glu->supno[jcol]];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  local_58 = (ulong)(uint)(iVar18 - iVar13);
  if (iVar18 - iVar13 == 0 || iVar18 < iVar13) {
LAB_0010a0e3:
    *usepr = 0;
    return jcol + 1;
  }
  lVar16 = (long)iVar11 * 0x10;
  iVar11 = iperm_c[jcol];
  uVar15 = (ulong)iVar13;
  z = (doublecomplex *)((long)pvVar5 + uVar15 * 0x10 + lVar16);
  uVar21 = 0;
  uVar22 = 0;
  uVar20 = 0xffffffff;
  iVar19 = iVar13;
  iVar17 = iVar13;
  local_88 = u;
  local_80 = lVar16;
  local_70 = pvVar5;
  local_60 = perm_r;
  do {
    dVar7 = (double)CONCAT44(uVar22,uVar21);
    dVar23 = z_abs1(z);
    pvVar10 = local_70;
    lVar9 = local_80;
    if (dVar7 < dVar23) {
      iVar19 = (int)uVar15;
    }
    if ((*usepr != 0) && (piVar6[(long)iVar12 + uVar15] == *pivrow)) {
      iVar17 = (int)uVar15;
    }
    if (dVar23 <= dVar7) {
      dVar23 = dVar7;
    }
    if (piVar6[(long)iVar12 + uVar15] == iVar11) {
      uVar20 = uVar15 & 0xffffffff;
    }
    uVar15 = uVar15 + 1;
    z = z + 1;
    uVar21 = SUB84(dVar23,0);
    uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
  } while ((long)uVar15 < (long)iVar18);
  jcol = (int)local_78;
  if ((dVar23 == 0.0) && (!NAN(dVar23))) goto LAB_0010a0e3;
  dVar23 = dVar23 * local_88;
  if (*usepr != 0) {
    dVar7 = z_abs1((doublecomplex *)((long)pvVar5 + (long)iVar17 * 0x10 + lVar16));
    if (((dVar7 == 0.0) && (!NAN(dVar7))) || (dVar7 < dVar23)) {
      *usepr = 0;
    }
    else {
      iVar19 = iVar17;
      if (*usepr != 0) {
        iVar11 = *pivrow;
        goto LAB_0010a1d2;
      }
    }
  }
  iVar17 = iVar19;
  if (-1 < (int)uVar20) {
    dVar7 = z_abs1((doublecomplex *)((long)pvVar5 + uVar20 * 0x10 + lVar16));
    iVar11 = (int)uVar20;
    if (dVar7 < dVar23) {
      iVar11 = iVar19;
    }
    if (dVar7 != 0.0) {
      iVar19 = iVar11;
    }
    iVar17 = iVar19;
    if (NAN(dVar7)) {
      iVar17 = iVar11;
    }
  }
  iVar11 = piVar6[(long)iVar12 + (long)iVar17];
  *pivrow = iVar11;
LAB_0010a1d2:
  local_60[iVar11] = jcol;
  if (iVar17 != iVar13) {
    iVar4 = piVar6[(long)iVar12 + (long)iVar17];
    piVar6[(long)iVar12 + (long)iVar17] = piVar6[(long)iVar12 + (long)iVar13];
    piVar6[(long)iVar12 + (long)iVar13] = iVar4;
    if (-1 < iVar13) {
      uVar15 = (ulong)((jcol - (int)local_68) + 1);
      iVar12 = iVar13;
      do {
        pdVar14 = (double *)((long)pvVar5 + (long)iVar17 * 0x10 + (long)iVar3 * 0x10);
        local_98.r = *pdVar14;
        local_98.i = pdVar14[1];
        puVar1 = (undefined8 *)((long)pvVar5 + (long)iVar12 * 0x10 + (long)iVar3 * 0x10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar5 + (long)iVar17 * 0x10 + (long)iVar3 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        pdVar14 = (double *)((long)pvVar5 + (long)iVar12 * 0x10 + (long)iVar3 * 0x10);
        *pdVar14 = local_98.r;
        pdVar14[1] = local_98.i;
        iVar12 = iVar12 + iVar18;
        iVar17 = iVar17 + iVar18;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  }
  local_50[7] = (float)((int)local_58 * 10) + local_50[7];
  z_div(&local_98,&local_48,(doublecomplex *)((long)pvVar5 + (long)iVar13 * 0x10 + lVar16));
  if (iVar18 <= iVar13 + 1) {
    return 0;
  }
  lVar16 = (long)(iVar13 + 1);
  pdVar14 = (double *)((long)pvVar10 + lVar9 + lVar16 * 0x10);
  do {
    dVar7 = *pdVar14;
    *pdVar14 = dVar7 * local_98.r + -pdVar14[1] * local_98.i;
    pdVar14[1] = pdVar14[1] * local_98.r + dVar7 * local_98.i;
    lVar16 = lVar16 + 1;
    pdVar14 = pdVar14 + 2;
  } while (lVar16 < iVar18);
  return 0;
}

Assistant:

int
zpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    doublecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    doublecomplex       temp;
    doublecomplex       *lu_sup_ptr; 
    doublecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = z_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = z_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = z_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    z_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	zz_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}